

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBlock_lazy2_dedicatedDictSearch_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *iEnd;
  long *plVar1;
  undefined8 *puVar2;
  U32 UVar3;
  ZSTD_matchState_t *pZVar4;
  U32 *pUVar5;
  seqDef *psVar6;
  undefined8 uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  size_t sVar11;
  ulong uVar12;
  int *piVar13;
  int *piVar14;
  BYTE *pBVar15;
  BYTE *pBVar16;
  long lVar17;
  ulong uVar18;
  seqStore_t *psVar19;
  int *piVar20;
  BYTE *pBVar21;
  int *piVar22;
  ulong uVar23;
  int *piVar24;
  size_t offbaseFound;
  uint local_d4;
  int *local_d0;
  size_t local_c8;
  uint local_bc;
  uint local_b8;
  uint local_b4;
  ulong local_b0;
  BYTE *local_a8;
  uint local_a0;
  uint local_9c;
  ZSTD_matchState_t *local_98;
  BYTE *local_90;
  int *local_88;
  BYTE *local_80;
  int *local_78;
  int *local_70;
  BYTE *local_68;
  int local_5c;
  int *local_58;
  seqStore_t *local_50;
  size_t local_48;
  BYTE *local_40;
  uint *local_38;
  
  local_a8 = (ms->window).base;
  local_b4 = (ms->cParams).minMatch;
  if (5 < local_b4) {
    local_b4 = 6;
  }
  if (local_b4 < 5) {
    local_b4 = 4;
  }
  local_9c = (ms->cParams).searchLog;
  local_b8 = 6;
  if (local_9c < 6) {
    local_b8 = local_9c;
  }
  local_a0 = (ms->window).dictLimit;
  local_b0 = (ulong)local_a0;
  if (local_b8 < 5) {
    local_b8 = 4;
  }
  local_90 = local_a8 + local_b0;
  pZVar4 = ms->dictMatchState;
  local_80 = (pZVar4->window).base;
  local_40 = local_80 + (pZVar4->window).dictLimit;
  local_88 = (int *)(pZVar4->window).nextSrc;
  uVar8 = ((int)src - ((int)local_40 + (int)local_90)) + (int)local_88;
  piVar22 = (int *)((long)src + (ulong)(uVar8 == 0));
  local_d4 = *rep;
  local_d0 = (int *)src;
  if (uVar8 < local_d4) {
    __assert_fail("offset_1 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7977,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  local_bc = rep[1];
  local_50 = seqStore;
  local_38 = rep;
  if (uVar8 < local_bc) {
    __assert_fail("offset_2 <= dictAndPrefixLength",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x7978,
                  "size_t ZSTD_compressBlock_lazy_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const searchMethod_e, const U32, const ZSTD_dictMode_e)"
                 );
  }
  iEnd = (int *)((long)src + srcSize);
  local_78 = (int *)((long)src + (srcSize - 0x10));
  local_a0 = ((int)local_80 - (int)local_88) + local_a0;
  ms->lazySkipping = 0;
  uVar18 = (ulong)ms->nextToUpdate;
  UVar3 = ms->rowHashLog;
  uVar8 = ((int)local_78 - (int)(local_a8 + uVar18)) + 1;
  if (7 < uVar8) {
    uVar8 = 8;
  }
  uVar10 = 0;
  if (local_a8 + uVar18 <= local_78) {
    uVar10 = uVar8;
  }
  pUVar5 = ms->hashTable;
  local_c8 = (size_t)(uVar10 + ms->nextToUpdate);
  local_68 = (BYTE *)(ulong)(0x38 - UVar3);
  local_70 = (int *)CONCAT44(local_70._4_4_,0x18 - UVar3);
  local_48 = 1L << ((byte)local_b8 & 0x3f);
  pBVar21 = ms->tagTable;
  local_98 = ms;
  for (; uVar18 < local_c8; uVar18 = uVar18 + 1) {
    if (0x20 < UVar3 + 8) {
LAB_0015e6c6:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4741,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
    }
    plVar1 = (long *)(local_a8 + uVar18);
    uVar12 = local_98->hashSalt;
    if (local_b4 == 5) {
      sVar11 = (*plVar1 * -0x30e4432345000000 ^ uVar12) >> ((byte)local_68 & 0x3f);
    }
    else if (local_b4 == 6) {
      sVar11 = ZSTD_hash6PtrS(plVar1,UVar3 + 8,uVar12);
    }
    else {
      sVar11 = (size_t)(((int)*plVar1 * -0x61c8864f ^ (uint)uVar12) >> ((byte)local_70 & 0x1f));
    }
    uVar8 = ((uint)(sVar11 >> 8) & 0xffffff) << ((byte)local_b8 & 0x1f);
    if (((ulong)(pUVar5 + uVar8) & 0x3f) != 0) {
LAB_0015e6e5:
      __assert_fail("ZSTD_isAligned(hashTable + relRow, 64)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x76a2,
                    "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
    }
    iVar9 = ZSTD_isAligned(pBVar21 + uVar8,local_48);
    if (iVar9 == 0) {
LAB_0015e704:
      __assert_fail("ZSTD_isAligned(tagTable + relRow, (size_t)1 << rowLog)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x76a3,
                    "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
    }
    local_98->hashCache[(uint)uVar18 & 7] = (U32)sVar11;
  }
  local_68 = local_80 + -(ulong)local_a0;
  local_70 = iEnd + -8;
  piVar24 = local_d0;
  uVar8 = local_bc;
  pZVar4 = local_98;
  psVar19 = local_50;
  do {
    while( true ) {
      local_bc = uVar8;
      local_d0 = piVar24;
      if (local_78 <= piVar22) {
        *local_38 = local_d4;
        local_38[1] = local_bc;
        return (long)iEnd - (long)local_d0;
      }
      piVar24 = (int *)((long)piVar22 + 1);
      uVar8 = (((int)piVar22 - (int)local_a8) - local_d4) + 1;
      piVar20 = (int *)(local_a8 + uVar8);
      if (uVar8 < (uint)local_b0) {
        piVar20 = (int *)(local_80 + (uVar8 - local_a0));
      }
      if ((uVar8 - (uint)local_b0 < 0xfffffffd) && (*piVar20 == *piVar24)) {
        piVar13 = iEnd;
        if (uVar8 < (uint)local_b0) {
          piVar13 = local_88;
        }
        sVar11 = ZSTD_count_2segments
                           ((BYTE *)((long)piVar22 + 5),(BYTE *)(piVar20 + 1),(BYTE *)iEnd,
                            (BYTE *)piVar13,local_90);
        uVar18 = sVar11 + 4;
      }
      else {
        uVar18 = 0;
      }
      offbaseFound = 999999999;
      if (local_b4 == 6) {
        if (local_b8 == 6) {
          uVar12 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_6
                             (pZVar4,(BYTE *)piVar22,(BYTE *)iEnd,&offbaseFound);
        }
        else if (local_b8 == 5) {
          uVar12 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_5
                             (pZVar4,(BYTE *)piVar22,(BYTE *)iEnd,&offbaseFound);
        }
        else {
          uVar12 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_4
                             (pZVar4,(BYTE *)piVar22,(BYTE *)iEnd,&offbaseFound);
        }
      }
      else if (local_b4 == 5) {
        if (local_b8 == 6) {
          uVar12 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_6
                             (pZVar4,(BYTE *)piVar22,(BYTE *)iEnd,&offbaseFound);
        }
        else if (local_b8 == 5) {
          uVar12 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_5
                             (pZVar4,(BYTE *)piVar22,(BYTE *)iEnd,&offbaseFound);
        }
        else {
          uVar12 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_4
                             (pZVar4,(BYTE *)piVar22,(BYTE *)iEnd,&offbaseFound);
        }
      }
      else if (local_b8 == 6) {
        uVar12 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_6
                           (pZVar4,(BYTE *)piVar22,(BYTE *)iEnd,&offbaseFound);
      }
      else if (local_b8 == 5) {
        uVar12 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_5
                           (pZVar4,(BYTE *)piVar22,(BYTE *)iEnd,&offbaseFound);
      }
      else {
        uVar12 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_4
                           (pZVar4,(BYTE *)piVar22,(BYTE *)iEnd,&offbaseFound);
      }
      uVar23 = uVar18;
      if (uVar18 < uVar12) {
        uVar23 = uVar12;
      }
      if (3 < uVar23) break;
      uVar18 = (long)piVar22 - (long)local_d0;
      piVar22 = (int *)((long)piVar22 + (uVar18 >> 8) + 1);
      pZVar4->lazySkipping = (uint)(0x7ff < uVar18);
      piVar24 = local_d0;
      uVar8 = local_bc;
    }
    local_c8 = 1;
    if (uVar18 < uVar12) {
      piVar24 = piVar22;
      local_c8 = offbaseFound;
    }
    while (piVar20 = local_d0, piVar22 < local_78) {
      piVar13 = (int *)((long)piVar22 + 1);
      uVar8 = ((int)piVar13 - (int)local_a8) - local_d4;
      piVar20 = (int *)(local_a8 + uVar8);
      if (uVar8 < (uint)local_b0) {
        piVar20 = (int *)(local_80 + (uVar8 - local_a0));
      }
      if ((uVar8 - (uint)local_b0 < 0xfffffffd) && (*piVar20 == *piVar13)) {
        piVar14 = iEnd;
        if (uVar8 < (uint)local_b0) {
          piVar14 = local_88;
        }
        sVar11 = ZSTD_count_2segments
                           ((BYTE *)((long)piVar22 + 5),(BYTE *)(piVar20 + 1),(BYTE *)iEnd,
                            (BYTE *)piVar14,local_90);
        if (sVar11 < 0xfffffffffffffffc) {
          uVar8 = 0x1f;
          if ((uint)local_c8 != 0) {
            for (; (uint)local_c8 >> uVar8 == 0; uVar8 = uVar8 - 1) {
            }
          }
          if ((int)((uVar8 ^ 0x1f) + (int)uVar23 * 3 + -0x1e) < (int)(sVar11 + 4) * 3) {
            local_c8 = 1;
            uVar23 = sVar11 + 4;
            piVar24 = piVar13;
          }
        }
      }
      offbaseFound = 999999999;
      if (local_b4 == 6) {
        if (local_b8 == 6) {
          uVar18 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_6
                             (pZVar4,(BYTE *)piVar13,(BYTE *)iEnd,&offbaseFound);
        }
        else if (local_b8 == 5) {
          uVar18 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_5
                             (pZVar4,(BYTE *)piVar13,(BYTE *)iEnd,&offbaseFound);
        }
        else {
          uVar18 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_4
                             (pZVar4,(BYTE *)piVar13,(BYTE *)iEnd,&offbaseFound);
        }
      }
      else if (local_b4 == 5) {
        if (local_b8 == 6) {
          uVar18 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_6
                             (pZVar4,(BYTE *)piVar13,(BYTE *)iEnd,&offbaseFound);
        }
        else if (local_b8 == 5) {
          uVar18 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_5
                             (pZVar4,(BYTE *)piVar13,(BYTE *)iEnd,&offbaseFound);
        }
        else {
          uVar18 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_4
                             (pZVar4,(BYTE *)piVar13,(BYTE *)iEnd,&offbaseFound);
        }
      }
      else if (local_b8 == 6) {
        uVar18 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_6
                           (pZVar4,(BYTE *)piVar13,(BYTE *)iEnd,&offbaseFound);
      }
      else if (local_b8 == 5) {
        uVar18 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_5
                           (pZVar4,(BYTE *)piVar13,(BYTE *)iEnd,&offbaseFound);
      }
      else {
        uVar18 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_4
                           (pZVar4,(BYTE *)piVar13,(BYTE *)iEnd,&offbaseFound);
      }
      if (uVar18 < 4) {
LAB_0015e05d:
        piVar20 = local_d0;
        if (local_78 <= piVar13) break;
        piVar13 = (int *)((long)piVar22 + 2);
        uVar8 = ((int)piVar13 - (int)local_a8) - local_d4;
        piVar20 = (int *)(local_a8 + uVar8);
        if (uVar8 < (uint)local_b0) {
          piVar20 = (int *)(local_80 + (uVar8 - local_a0));
        }
        if ((uVar8 - (uint)local_b0 < 0xfffffffd) && (*piVar20 == *piVar13)) {
          piVar14 = iEnd;
          if (uVar8 < (uint)local_b0) {
            piVar14 = local_88;
          }
          sVar11 = ZSTD_count_2segments
                             ((BYTE *)((long)piVar22 + 6),(BYTE *)(piVar20 + 1),(BYTE *)iEnd,
                              (BYTE *)piVar14,local_90);
          if (sVar11 < 0xfffffffffffffffc) {
            uVar8 = 0x1f;
            if ((uint)local_c8 != 0) {
              for (; (uint)local_c8 >> uVar8 == 0; uVar8 = uVar8 - 1) {
              }
            }
            if ((int)((uVar8 ^ 0x1f) + (int)uVar23 * 4 + -0x1e) < (int)(sVar11 + 4) * 4) {
              local_c8 = 1;
              uVar23 = sVar11 + 4;
              piVar24 = piVar13;
            }
          }
        }
        piVar20 = local_d0;
        offbaseFound = 999999999;
        if (local_b4 == 6) {
          if (local_b8 == 6) {
            uVar18 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_6
                               (pZVar4,(BYTE *)piVar13,(BYTE *)iEnd,&offbaseFound);
          }
          else if (local_b8 == 5) {
            uVar18 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_5
                               (pZVar4,(BYTE *)piVar13,(BYTE *)iEnd,&offbaseFound);
          }
          else {
            uVar18 = ZSTD_RowFindBestMatch_dedicatedDictSearch_6_4
                               (pZVar4,(BYTE *)piVar13,(BYTE *)iEnd,&offbaseFound);
          }
        }
        else if (local_b4 == 5) {
          if (local_b8 == 6) {
            uVar18 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_6
                               (pZVar4,(BYTE *)piVar13,(BYTE *)iEnd,&offbaseFound);
          }
          else if (local_b8 == 5) {
            uVar18 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_5
                               (pZVar4,(BYTE *)piVar13,(BYTE *)iEnd,&offbaseFound);
          }
          else {
            uVar18 = ZSTD_RowFindBestMatch_dedicatedDictSearch_5_4
                               (pZVar4,(BYTE *)piVar13,(BYTE *)iEnd,&offbaseFound);
          }
        }
        else if (local_b8 == 6) {
          uVar18 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_6
                             (pZVar4,(BYTE *)piVar13,(BYTE *)iEnd,&offbaseFound);
        }
        else if (local_b8 == 5) {
          uVar18 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_5
                             (pZVar4,(BYTE *)piVar13,(BYTE *)iEnd,&offbaseFound);
        }
        else {
          uVar18 = ZSTD_RowFindBestMatch_dedicatedDictSearch_4_4
                             (pZVar4,(BYTE *)piVar13,(BYTE *)iEnd,&offbaseFound);
        }
        if (uVar18 < 4) break;
        uVar8 = 0x1f;
        if ((uint)local_c8 != 0) {
          for (; (uint)local_c8 >> uVar8 == 0; uVar8 = uVar8 - 1) {
          }
        }
        iVar9 = 0x1f;
        if ((uint)offbaseFound != 0) {
          for (; (uint)offbaseFound >> iVar9 == 0; iVar9 = iVar9 + -1) {
          }
        }
        if ((int)uVar18 * 4 - iVar9 <= (int)((uVar8 ^ 0x1f) + (int)uVar23 * 4 + -0x18)) break;
      }
      else {
        uVar8 = 0x1f;
        if ((uint)local_c8 != 0) {
          for (; (uint)local_c8 >> uVar8 == 0; uVar8 = uVar8 - 1) {
          }
        }
        iVar9 = 0x1f;
        if ((uint)offbaseFound != 0) {
          for (; (uint)offbaseFound >> iVar9 == 0; iVar9 = iVar9 + -1) {
          }
        }
        if ((int)uVar18 * 4 - iVar9 <= (int)((uVar8 ^ 0x1f) + (int)uVar23 * 4 + -0x1b))
        goto LAB_0015e05d;
      }
      piVar22 = piVar13;
      local_c8 = offbaseFound;
      uVar23 = uVar18;
      piVar24 = piVar22;
    }
    UVar3 = (U32)local_c8;
    if (3 < local_c8) {
      pBVar15 = (BYTE *)((long)piVar24 + (-(long)local_a8 - local_c8) + -0xfffffffd);
      pBVar16 = local_a8;
      pBVar21 = local_90;
      if ((uint)pBVar15 < (uint)local_b0) {
        pBVar16 = local_68;
        pBVar21 = local_40;
      }
      pBVar16 = pBVar16 + ((ulong)pBVar15 & 0xffffffff);
      for (; ((piVar20 < piVar24 && (pBVar21 < pBVar16)) &&
             (*(BYTE *)((long)piVar24 + -1) == pBVar16[-1])); piVar24 = (int *)((long)piVar24 + -1))
      {
        pBVar16 = pBVar16 + -1;
        uVar23 = uVar23 + 1;
      }
      local_bc = local_d4;
      local_d4 = UVar3 - 3;
    }
    if (psVar19->maxNbSeq <= (ulong)((long)psVar19->sequences - (long)psVar19->sequencesStart >> 3))
    {
LAB_0015e761:
      __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468b,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0x20000 < psVar19->maxNbLit) {
LAB_0015e780:
      __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468d,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    uVar18 = (long)piVar24 - (long)piVar20;
    pBVar21 = psVar19->lit;
    if (psVar19->litStart + psVar19->maxNbLit < pBVar21 + uVar18) {
LAB_0015e723:
      __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468e,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (iEnd < piVar24) {
LAB_0015e742:
      __assert_fail("literals + litLength <= litLimit",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x468f,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    local_58 = piVar24;
    if (local_70 < piVar24) {
      ZSTD_safecopyLiterals(pBVar21,(BYTE *)piVar20,(BYTE *)piVar24,(BYTE *)local_70);
LAB_0015e2f2:
      psVar19->lit = psVar19->lit + uVar18;
      if (0xffff < uVar18) {
        if (psVar19->longLengthType != ZSTD_llt_none) {
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46a0,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        psVar19->longLengthType = ZSTD_llt_literalLength;
        psVar19->longLengthPos =
             (U32)((ulong)((long)psVar19->sequences - (long)psVar19->sequencesStart) >> 3);
      }
    }
    else {
      uVar7 = *(undefined8 *)(piVar20 + 2);
      *(undefined8 *)pBVar21 = *(undefined8 *)piVar20;
      *(undefined8 *)(pBVar21 + 8) = uVar7;
      pBVar21 = psVar19->lit;
      if (0x10 < uVar18) {
        if ((BYTE *)0xffffffffffffffe0 < pBVar21 + 0x10 + (-0x10 - (long)(piVar20 + 4))) {
          __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x36a6,
                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)")
          ;
        }
        uVar7 = *(undefined8 *)(piVar20 + 6);
        *(undefined8 *)(pBVar21 + 0x10) = *(undefined8 *)(piVar20 + 4);
        *(undefined8 *)(pBVar21 + 0x18) = uVar7;
        if (0x20 < (long)uVar18) {
          lVar17 = 0;
          do {
            puVar2 = (undefined8 *)((long)piVar20 + lVar17 + 0x20);
            uVar7 = puVar2[1];
            pBVar16 = pBVar21 + lVar17 + 0x20;
            *(undefined8 *)pBVar16 = *puVar2;
            *(undefined8 *)(pBVar16 + 8) = uVar7;
            puVar2 = (undefined8 *)((long)piVar20 + lVar17 + 0x30);
            uVar7 = puVar2[1];
            *(undefined8 *)(pBVar16 + 0x10) = *puVar2;
            *(undefined8 *)(pBVar16 + 0x18) = uVar7;
            lVar17 = lVar17 + 0x20;
          } while (pBVar16 + 0x20 < pBVar21 + uVar18);
        }
        goto LAB_0015e2f2;
      }
      psVar19->lit = pBVar21 + uVar18;
    }
    psVar6 = psVar19->sequences;
    psVar6->litLength = (U16)uVar18;
    psVar6->offBase = UVar3;
    if (uVar23 < 3) {
LAB_0015e79f:
      __assert_fail("matchLength >= MINMATCH",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x46aa,
                    "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                   );
    }
    if (0xffff < uVar23 - 3) {
      if (psVar19->longLengthType != ZSTD_llt_none) {
LAB_0015e7be:
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x46ad,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      psVar19->longLengthType = ZSTD_llt_matchLength;
      psVar19->longLengthPos = (U32)((ulong)((long)psVar6 - (long)psVar19->sequencesStart) >> 3);
    }
    psVar6->mlBase = (U16)(uVar23 - 3);
    psVar19->sequences = psVar6 + 1;
    if (local_98->lazySkipping != 0) {
      piVar22 = (int *)(ulong)local_98->nextToUpdate;
      UVar3 = local_98->rowHashLog;
      uVar8 = ((int)local_78 - (int)(local_a8 + (long)piVar22)) + 1;
      if (7 < uVar8) {
        uVar8 = 8;
      }
      if (local_78 < local_a8 + (long)piVar22) {
        uVar8 = 0;
      }
      pUVar5 = local_98->hashTable;
      pBVar21 = local_98->tagTable;
      local_d0 = (int *)(ulong)(uVar8 + local_98->nextToUpdate);
      local_c8 = (size_t)(0x38 - UVar3);
      local_5c = 0x18 - UVar3;
      for (; piVar22 < local_d0; piVar22 = (int *)((long)piVar22 + 1)) {
        if (0x20 < UVar3 + 8) goto LAB_0015e6c6;
        plVar1 = (long *)(local_a8 + (long)piVar22);
        uVar18 = local_98->hashSalt;
        if (local_b4 == 5) {
          sVar11 = (*plVar1 * -0x30e4432345000000 ^ uVar18) >> ((byte)local_c8 & 0x3f);
        }
        else if (local_b4 == 6) {
          sVar11 = ZSTD_hash6PtrS(plVar1,UVar3 + 8,uVar18);
        }
        else {
          sVar11 = (size_t)(((int)*plVar1 * -0x61c8864f ^ (uint)uVar18) >> ((byte)local_5c & 0x1f));
        }
        uVar8 = ((uint)(sVar11 >> 8) & 0xffffff) << ((byte)local_b8 & 0x1f);
        if (((ulong)(pUVar5 + uVar8) & 0x3f) != 0) goto LAB_0015e6e5;
        iVar9 = ZSTD_isAligned(pBVar21 + uVar8,local_48);
        if (iVar9 == 0) goto LAB_0015e704;
        local_98->hashCache[(uint)piVar22 & 7] = (U32)sVar11;
      }
      local_98->lazySkipping = 0;
      psVar19 = local_50;
    }
    uVar10 = local_bc;
    for (piVar22 = (int *)((long)local_58 + uVar23); uVar8 = uVar10, piVar24 = piVar22,
        pZVar4 = local_98, piVar22 <= local_78; piVar22 = (int *)((long)piVar22 + sVar11 + 4)) {
      uVar10 = ((int)piVar22 - (int)local_a8) - uVar8;
      pBVar21 = local_a8;
      if (uVar10 < (uint)local_b0) {
        pBVar21 = local_68;
      }
      if ((0xfffffffc < uVar10 - (uint)local_b0) || (*(int *)(pBVar21 + uVar10) != *piVar22)) break;
      piVar24 = iEnd;
      if (uVar10 < (uint)local_b0) {
        piVar24 = local_88;
      }
      sVar11 = ZSTD_count_2segments
                         ((BYTE *)(piVar22 + 1),(BYTE *)((long)(pBVar21 + uVar10) + 4),(BYTE *)iEnd,
                          (BYTE *)piVar24,local_90);
      if (psVar19->maxNbSeq <=
          (ulong)((long)psVar19->sequences - (long)psVar19->sequencesStart >> 3)) goto LAB_0015e761;
      if (0x20000 < psVar19->maxNbLit) goto LAB_0015e780;
      pBVar21 = psVar19->lit;
      if (psVar19->litStart + psVar19->maxNbLit < pBVar21) goto LAB_0015e723;
      if (iEnd < piVar22) goto LAB_0015e742;
      if (local_70 < piVar22) {
        ZSTD_safecopyLiterals(pBVar21,(BYTE *)piVar22,(BYTE *)piVar22,(BYTE *)local_70);
      }
      else {
        uVar7 = *(undefined8 *)(piVar22 + 2);
        *(undefined8 *)pBVar21 = *(undefined8 *)piVar22;
        *(undefined8 *)(pBVar21 + 8) = uVar7;
      }
      psVar6 = psVar19->sequences;
      psVar6->litLength = 0;
      psVar6->offBase = 1;
      if (sVar11 + 4 < 3) goto LAB_0015e79f;
      if (0xffff < sVar11 + 1) {
        if (psVar19->longLengthType != ZSTD_llt_none) goto LAB_0015e7be;
        psVar19->longLengthType = ZSTD_llt_matchLength;
        psVar19->longLengthPos = (U32)((ulong)((long)psVar6 - (long)psVar19->sequencesStart) >> 3);
      }
      psVar6->mlBase = (U16)(sVar11 + 1);
      psVar19->sequences = psVar6 + 1;
      uVar10 = local_d4;
      local_d4 = uVar8;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy2_dedicatedDictSearch_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 2, ZSTD_dedicatedDictSearch);
}